

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lazy_segtree_test.cpp
# Opt level: O1

void __thiscall LazySegtree_LotsOfQueries_Test::TestBody(LazySegtree_LotsOfQueries_Test *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer __s;
  long lVar4;
  value_type_conflict *__val;
  int to;
  undefined1 auStack_88 [8];
  Naive naive;
  undefined1 local_68 [8];
  Segtree tree;
  
  local_68 = (undefined1  [8])0xde0b6b3a7640000;
  tree.INF = 0x6400000000;
  tree.l = 0;
  tree.r = 0;
  tree.val = 0;
  tree.lazy = 0;
  tree.lson = (Segtree *)0x0;
  auStack_88 = (undefined1  [8])0x0;
  naive.vals.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  naive.vals.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __s = (pointer)operator_new(800);
  iVar1 = 0;
  auStack_88 = (undefined1  [8])__s;
  naive.vals.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_start = __s;
  naive.vals.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = __s + 100;
  memset(__s,0,800);
  naive.vals.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_start = __s + 100;
  compare((Segtree *)local_68,(Naive *)auStack_88);
  do {
    iVar2 = 0;
    tree.rson._4_4_ = iVar1;
    do {
      tree.rson._0_4_ = iVar2;
      iVar1 = rand();
      iVar1 = iVar1 % 99;
      iVar2 = rand();
      iVar2 = iVar2 % (99 - iVar1);
      to = iVar2 + iVar1 + 1;
      iVar3 = rand();
      Segtree::rangeUpdate((Segtree *)local_68,iVar1,to,(long)(iVar3 % 100));
      if (-1 < iVar2) {
        lVar4 = (long)iVar1;
        do {
          __s[lVar4] = __s[lVar4] + (long)(iVar3 % 100);
          lVar4 = lVar4 + 1;
        } while (to != lVar4);
      }
      iVar2 = (int)tree.rson + 1;
    } while (iVar2 != 10);
    compare((Segtree *)local_68,(Naive *)auStack_88);
    iVar1 = tree.rson._4_4_ + 1;
  } while (iVar1 != 100);
  operator_delete(__s);
  Segtree::~Segtree((Segtree *)local_68);
  return;
}

Assistant:

TEST(LazySegtree, LotsOfQueries) {
    int n = 100;
    Segtree tree(0,n);
    Naive naive(n);
    compare(tree, naive);
    
    rep(it1,0,100) {
        rep(it2,0,10) {
            int fr = rand() % (n-1);
            int to = rand() % (n-1-fr) + 1 + fr;
            int val = rand() % 100;

            tree.rangeUpdate(fr, to, val);
            naive.rangeUpdate(fr, to, val);
        }
        compare(tree, naive);
    }
}